

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lca_test.cpp
# Opt level: O3

void __thiscall LCA_LCA_Test::TestBody(LCA_LCA_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *message;
  int b;
  int a;
  AssertHelper local_60;
  ulong local_58;
  internal local_50 [8];
  AssertionResult gtest_ar;
  int iStack_38;
  int aa;
  
  local_58 = 0;
  do {
    generateTree(0x32);
    initLCA(0,0x32);
    a = 0;
    do {
      b = 0;
      do {
        iVar4 = a;
        iVar2 = b;
        gtest_ar.message_.ptr_._4_4_ = a;
        if (a != b) {
          do {
            if (d[iVar4] < d[iVar2]) {
              iVar2 = pred[iVar2][0];
            }
            else {
              iVar4 = pred[iVar4][0];
              gtest_ar.message_.ptr_._4_4_ = iVar4;
            }
          } while (iVar4 != iVar2);
        }
        iStack_38 = lca(a,b);
        testing::internal::CmpHelperEQ<int,int>
                  (local_50,"aa","lca(a, b)",(int *)((long)&gtest_ar.message_.ptr_ + 4),
                   &stack0xffffffffffffffc8);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffc8);
          message = "";
          if (gtest_ar._0_8_ != 0) {
            message = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/graph/lca_test.cpp"
                     ,0x42,message);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&stack0xffffffffffffffc8);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (((CONCAT44(aa,iStack_38) != 0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
             ((long *)CONCAT44(aa,iStack_38) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(aa,iStack_38) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        b = b + 1;
      } while (b != 0x32);
      a = a + 1;
    } while (a != 0x32);
    uVar3 = (int)local_58 + 1;
    local_58 = (ulong)uVar3;
  } while (uVar3 != 10);
  return;
}

Assistant:

TEST(LCA, LCA) {
    int n = 50;
    rep(tests, 0, 10) {
        generateTree(n);
        initLCA(0, n);
        rep(a, 0, n) rep(b, 0, n) {
            int aa = a, bb = b;
            while (aa != bb) {
                if (d[aa] >= d[bb]) {
                    aa = pred[aa][0];
                } else {
                    bb = pred[bb][0];
                }
            }
            EXPECT_EQ(aa, lca(a, b));
        }
    }
}